

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void parallel_for_1d(thread_pool *thread_pool,_func_void_parallel_task_1d_ptr_size_t *compute,
                    parallel_task_1d *init,size_t task_size,range *range)

{
  size_t count;
  size_t sVar1;
  work_item *tasks_00;
  work_item *pwVar2;
  work_fn_t local_70;
  size_t i;
  size_t chunk_size;
  work_item *previous_task;
  work_item *first_task;
  work_item *current_task;
  work_item *tasks;
  size_t task_count;
  size_t thread_count;
  range *range_local;
  size_t task_size_local;
  parallel_task_1d *init_local;
  _func_void_parallel_task_1d_ptr_size_t *compute_local;
  thread_pool *thread_pool_local;
  
  count = get_thread_count(thread_pool);
  sVar1 = count * 2;
  tasks_00 = (work_item *)xmalloc(task_size * sVar1);
  init_parallel_tasks(tasks_00,&init->work_item,(_func_void_work_item_ptr_size_t *)compute,task_size
                      ,sVar1);
  chunk_size = 0;
  sVar1 = compute_chunk_size(range->end - range->begin,sVar1);
  local_70 = (work_fn_t)range->begin;
  previous_task = tasks_00;
  first_task = tasks_00;
  while( true ) {
    if ((work_fn_t)range->end <= local_70) {
      if (chunk_size != 0) {
        *(undefined8 *)(chunk_size + 8) = 0;
        submit_work(thread_pool,previous_task,(work_item *)chunk_size);
      }
      wait_for_completion(thread_pool,0);
      free(tasks_00);
      return;
    }
    if (first_task == (work_item *)0x0) break;
    first_task[1].work_fn = local_70;
    pwVar2 = (work_item *)range_end((size_t)local_70,sVar1,range->end);
    first_task[1].next = pwVar2;
    chunk_size = (size_t)first_task;
    pwVar2 = first_task->next;
    if (first_task->next == (work_item *)0x0) {
      submit_work(thread_pool,previous_task,first_task);
      previous_task = wait_for_completion(thread_pool,count);
      chunk_size = 0;
      pwVar2 = previous_task;
    }
    first_task = pwVar2;
    local_70 = local_70 + sVar1;
  }
  __assert_fail("current_task",
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                ,0x108,
                "void parallel_for_1d(struct thread_pool *, void (*)(struct parallel_task_1d *, size_t), struct parallel_task_1d *, size_t, const struct range *)"
               );
}

Assistant:

void parallel_for_1d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_1d*, size_t),
    struct parallel_task_1d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size = compute_chunk_size(range[0].end - range[0].begin, task_count);
    for (size_t i = range[0].begin; i < range[0].end; i += chunk_size) {
        assert(current_task);
        ((struct parallel_task_1d*)current_task)->range.begin = i;
        ((struct parallel_task_1d*)current_task)->range.end   = range_end(i, chunk_size, range[0].end);
        previous_task = current_task;
        current_task = current_task->next;
        if (!current_task) {
            submit_work(thread_pool, first_task, previous_task);
            first_task = current_task = wait_for_completion(thread_pool, thread_count);
            previous_task = NULL;
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}